

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O1

s32 __thiscall irr::gui::CGUITabControl::calculateScrollIndexFromActive(CGUITabControl *this)

{
  IGUITab *pIVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong in_RAX;
  long *plVar5;
  undefined8 uVar6;
  int iVar7;
  s32 sVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  s32 pos_rr;
  undefined8 local_38;
  
  sVar8 = 0;
  if (((this->ScrollControl == true) &&
      ((this->Tabs).m_data.
       super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->Tabs).m_data.
       super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
       super__Vector_impl_data._M_finish)) &&
     (local_38 = in_RAX, plVar5 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))(),
     plVar5 != (long *)0x0)) {
    sVar8 = 0;
    plVar5 = (long *)(**(code **)(*plVar5 + 0x30))(plVar5,0);
    if (plVar5 != (long *)0x0) {
      iVar9 = (this->UpButton->super_IGUIElement).AbsoluteRect.UpperLeftCorner.X;
      uVar11 = (ulong)this->ActiveTabIndex;
      if (0 < (long)uVar11) {
        iVar10 = *(int *)&this->field_0x40;
        local_38 = CONCAT44(local_38._4_4_,iVar9);
        iVar9 = (iVar10 + iVar9) / 2;
        do {
          pIVar1 = (this->Tabs).m_data.
                   super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar11];
          if (pIVar1 != (IGUITab *)0x0) {
            uVar6 = (**(code **)(*(long *)&(pIVar1->super_IGUIElement).super_IEventReceiver + 0xa8))
                              ();
            iVar3 = (**(code **)(*plVar5 + 8))(plVar5,uVar6);
            iVar3 = iVar3 + this->TabExtraWidth;
            iVar7 = this->TabMaxWidth;
            iVar4 = iVar3;
            if (iVar7 <= iVar3) {
              iVar4 = iVar7;
            }
            if (0 < iVar7) {
              iVar3 = iVar4;
            }
            iVar7 = iVar3 / 2;
            if (uVar11 != (uint)this->ActiveTabIndex) {
              iVar7 = iVar3;
            }
            iVar9 = iVar9 - iVar7;
            if (iVar9 < iVar10 + 2) goto LAB_002290a7;
          }
          bVar2 = 1 < (long)uVar11;
          uVar11 = uVar11 - 1;
        } while (bVar2);
        uVar11 = 0;
LAB_002290a7:
        iVar9 = (int)local_38;
      }
      iVar10 = (int)uVar11;
      if (iVar10 != 0) {
        local_38 = local_38 & 0xffffffff;
        bVar2 = needScrollControl(this,iVar10,true,(s32 *)((long)&local_38 + 4));
        if ((1 < iVar10) && (!bVar2)) {
          uVar11 = uVar11 & 0xffffffff;
          do {
            pIVar1 = (this->Tabs).m_data.
                     super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar11 - 1];
            if (pIVar1 != (IGUITab *)0x0) {
              uVar6 = (**(code **)(*(long *)&(pIVar1->super_IGUIElement).super_IEventReceiver + 0xa8
                                  ))();
              iVar4 = (**(code **)(*plVar5 + 8))(plVar5,uVar6);
              iVar4 = iVar4 + this->TabExtraWidth;
              iVar10 = this->TabMaxWidth;
              iVar7 = iVar10;
              if (iVar4 < iVar10) {
                iVar7 = iVar4;
              }
              if (iVar10 < 1) {
                iVar7 = iVar4;
              }
              iVar7 = iVar7 + local_38._4_4_;
              local_38 = CONCAT44(iVar7,(int)local_38);
              if (iVar9 + -2 < iVar7) goto LAB_0022913e;
            }
            bVar2 = 2 < (long)uVar11;
            uVar11 = uVar11 - 1;
          } while (bVar2);
          uVar11 = 1;
        }
LAB_0022913e:
        sVar8 = (s32)uVar11;
      }
    }
  }
  return sVar8;
}

Assistant:

s32 CGUITabControl::calculateScrollIndexFromActive()
{
	if (!ScrollControl || Tabs.empty())
		return 0;

	IGUISkin *skin = Environment->getSkin();
	if (!skin)
		return false;

	IGUIFont *font = skin->getFont();
	if (!font)
		return false;

	const s32 pos_left = AbsoluteRect.UpperLeftCorner.X + 2;
	const s32 pos_right = UpButton->getAbsolutePosition().UpperLeftCorner.X - 2;

	// Move from center to the left border left until it is reached
	s32 pos_cl = (pos_left + pos_right) / 2;
	s32 i = ActiveTabIndex;
	for (; i > 0; --i) {
		if (!Tabs[i])
			continue;

		s32 len = calcTabWidth(font, Tabs[i]->getText());
		if (i == ActiveTabIndex)
			len /= 2;
		if (pos_cl - len < pos_left)
			break;

		pos_cl -= len;
	}
	if (i == 0)
		return i;

	// Is scrolling to right still possible?
	s32 pos_rr = 0;
	if (needScrollControl(i, true, &pos_rr))
		return i; // Yes? -> OK

	// No? -> Decrease "i" more. Append tabs until scrolling becomes necessary
	for (--i; i > 0; --i) {
		if (!Tabs[i])
			continue;

		pos_rr += calcTabWidth(font, Tabs[i]->getText());
		if (pos_rr > pos_right)
			break;
	}
	return i + 1;
}